

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O2

int32 rw::getSizeMesh(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  sbyte sVar2;
  int iVar3;
  
  lVar1 = *(long *)((long)object + 0x90);
  if (lVar1 == 0) {
    return -1;
  }
  iVar3 = (uint)*(ushort *)(lVar1 + 4) * 8 + 0xc;
  if ((*(byte *)((long)object + 0x13) & 1) == 0) {
    sVar2 = 2;
  }
  else {
    if (**(int **)((long)object + 0x98) != 0xb) {
      return iVar3;
    }
    sVar2 = 1;
  }
  return iVar3 + (*(int *)(lVar1 + 8) << sVar2);
}

Assistant:

static int32
getSizeMesh(void *object, int32, int32)
{
	Geometry *geo = (Geometry*)object;
	if(geo->meshHeader == nil)
		return -1;
	int32 size = 12 + geo->meshHeader->numMeshes*8;
	if(geo->flags & Geometry::NATIVE){
		assert(geo->instData != nil);
		if(geo->instData->platform == PLATFORM_WDGL)
			size += geo->meshHeader->totalIndices*2;
	}else{
		size += geo->meshHeader->totalIndices*4;
	}
	return size;
}